

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void cwde_(PDISASM pMyDisasm)

{
  PDISASM pMyDisasm_local;
  
  (pMyDisasm->Instruction).Category = 0x10001;
  (pMyDisasm->Operand1).OpType = 0x20000;
  (pMyDisasm->Operand1).Registers.type = 1;
  (pMyDisasm->Operand1).Registers.gpr = 1;
  if ((pMyDisasm->Reserved_).OperandSize == 0x40) {
    if ((pMyDisasm->Reserved_).SYNTAX_ == 0x400) {
      strcpy((pMyDisasm->Instruction).Mnemonic,"cltq");
    }
    else {
      strcpy((pMyDisasm->Instruction).Mnemonic,"cdqe");
    }
    (pMyDisasm->Operand1).OpSize = 0x40;
  }
  else if ((pMyDisasm->Reserved_).OperandSize == 0x20) {
    if ((pMyDisasm->Reserved_).SYNTAX_ == 0x400) {
      strcpy((pMyDisasm->Instruction).Mnemonic,"cwtl");
    }
    else {
      strcpy((pMyDisasm->Instruction).Mnemonic,"cwde");
    }
    (pMyDisasm->Operand1).OpSize = 0x20;
  }
  else {
    if ((pMyDisasm->Reserved_).SYNTAX_ == 0x400) {
      strcpy((pMyDisasm->Instruction).Mnemonic,"cbtw");
    }
    else {
      strcpy((pMyDisasm->Instruction).Mnemonic,"cbw");
    }
    (pMyDisasm->Operand1).OpSize = 0x10;
  }
  (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 1;
  return;
}

Assistant:

void __bea_callspec__ cwde_(PDISASM pMyDisasm)
{
  pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+DATA_TRANSFER;
  pMyDisasm->Operand1.OpType = REGISTER_TYPE;
  pMyDisasm->Operand1.Registers.type = GENERAL_REG;
  pMyDisasm->Operand1.Registers.gpr = REG0;
  if (GV.OperandSize == 64) {
      if (GV.SYNTAX_ == ATSyntax) {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "cltq");
          #endif
      }
      else {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "cdqe");
          #endif
      }
      pMyDisasm->Operand1.OpSize = 64;
  }
  else if (GV.OperandSize == 32) {
      if (GV.SYNTAX_ == ATSyntax) {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "cwtl");
          #endif
      }
      else {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "cwde");
          #endif
      }
      pMyDisasm->Operand1.OpSize = 32;
  }
  else {
      if (GV.SYNTAX_ == ATSyntax) {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "cbtw");
          #endif
      }
      else {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "cbw");
          #endif
      }
      pMyDisasm->Operand1.OpSize = 16;
  }
  GV.EIP_++;
}